

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::WildcardPattern::normaliseString
          (string *__return_storage_ptr__,WildcardPattern *this,string *str)

{
  long in_FS_OFFSET;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_caseSensitivity == No) {
    toLower(&local_30,str);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,(string *)str);
  }
  trim(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string WildcardPattern::normaliseString( std::string const& str ) const {
        return trim( m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str );
    }